

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  ulong uVar1;
  uint num_rects;
  ImFontAtlasCustomRect *pIVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  long lVar8;
  int *piVar9;
  stbrp_coord *psVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ImVector<stbrp_rect> pack_rects;
  stbrp_rect *psStack_30;
  
  num_rects = (atlas->CustomRects).Size;
  psStack_30 = (stbrp_rect *)0x0;
  if (0 < (int)num_rects) {
    uVar11 = 8;
    if (7 < (int)num_rects) {
      uVar11 = num_rects;
    }
    if (0 < (int)uVar11) {
      psStack_30 = (stbrp_rect *)ImGui::MemAlloc((ulong)uVar11 * 0x18);
    }
  }
  memset(psStack_30,0,(ulong)num_rects * 0x18);
  lVar8 = (long)(atlas->CustomRects).Size;
  if (0 < lVar8) {
    pIVar2 = (atlas->CustomRects).Data;
    psVar10 = &psStack_30->w;
    lVar13 = 0;
    do {
      uVar1 = *(ulong *)((long)&pIVar2->Width + lVar13);
      auVar3._8_4_ = 0;
      auVar3._0_8_ = uVar1;
      auVar3._12_2_ = (short)(uVar1 >> 0x30);
      auVar4._8_2_ = (short)(uVar1 >> 0x20);
      auVar4._0_8_ = uVar1;
      auVar4._10_4_ = auVar3._10_4_;
      auVar7._6_8_ = 0;
      auVar7._0_6_ = auVar4._8_6_;
      auVar5._4_2_ = (short)(uVar1 >> 0x10);
      auVar5._0_4_ = (uint)uVar1;
      auVar5._6_8_ = SUB148(auVar7 << 0x40,6);
      auVar6._4_10_ = auVar5._4_10_;
      auVar6._0_4_ = (uint)uVar1 & 0xffff;
      *(long *)psVar10 = auVar6._0_8_;
      psVar10 = psVar10 + 6;
      lVar13 = lVar13 + 0x20;
    } while (lVar8 * 0x20 != lVar13);
  }
  stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,psStack_30,num_rects);
  if (0 < (long)(int)num_rects) {
    piVar9 = &psStack_30->was_packed;
    lVar8 = 0;
    do {
      if (*piVar9 != 0) {
        pIVar2 = (atlas->CustomRects).Data;
        *(short *)((long)&pIVar2->X + lVar8) = (short)piVar9[-2];
        iVar12 = piVar9[-1];
        *(short *)((long)&pIVar2->Y + lVar8) = (short)iVar12;
        iVar12 = iVar12 + piVar9[-3];
        if (iVar12 < atlas->TexHeight) {
          iVar12 = atlas->TexHeight;
        }
        atlas->TexHeight = iVar12;
      }
      lVar8 = lVar8 + 0x20;
      piVar9 = piVar9 + 6;
    } while ((long)(int)num_rects * 0x20 != lVar8);
  }
  if (psStack_30 != (stbrp_rect *)0x0) {
    ImGui::MemFree(psStack_30);
  }
  return;
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.
#ifdef __GNUC__
    if (user_rects.Size < 1) { __builtin_unreachable(); } // Workaround for GCC bug if IM_ASSERT() is defined to conditionally throw (see #5343)
#endif

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = (unsigned short)pack_rects[i].x;
            user_rects[i].Y = (unsigned short)pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}